

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path_test.cpp
# Opt level: O2

void __thiscall
portability_path_test_portability_path_test_path_get_module_name_with_random_extension_Test::
~portability_path_test_portability_path_test_path_get_module_name_with_random_extension_Test
          (portability_path_test_portability_path_test_path_get_module_name_with_random_extension_Test
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(portability_path_test, portability_path_test_path_get_module_name_with_random_extension)
{
	static const char base[] = "/a/b/c/asd.etc.asd";
	static const char result[] = "asd.etc.asd";
	static const char extension[] = "txt";

	string_name name;

	size_t size = portability_path_get_module_name(base, sizeof(base), extension, sizeof(extension), name, NAME_SIZE);

	EXPECT_EQ((int)0, (int)strcmp(name, result));
	EXPECT_EQ((size_t)size, (size_t)sizeof(result));
	EXPECT_EQ((char)'\0', (char)result[size - 1]);
}